

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O0

shared_ptr<gui::TextBox> gui::TextBox::create(Theme *theme,String *name)

{
  shared_ptr<gui::TextBoxStyle> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TextBox *in_RSI;
  element_type *in_RDI;
  shared_ptr<gui::TextBox> sVar1;
  element_type *this;
  Theme *this_00;
  locale local_50 [16];
  locale *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  _Base_ptr in_stack_ffffffffffffffd0;
  _Base_ptr in_stack_ffffffffffffffe0;
  TextBox *this_01;
  
  this = in_RDI;
  operator_new(0x3a8);
  this_00 = (Theme *)local_50;
  this_01 = in_RSI;
  std::locale::locale((locale *)this_00);
  sf::String::String((String *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     in_stack_ffffffffffffffc0);
  Theme::getStyle<gui::TextBoxStyle>(this_00,(String *)in_RSI);
  TextBox(this_01,in_RDX,(String *)in_stack_ffffffffffffffe0);
  std::shared_ptr<gui::TextBox>::shared_ptr<gui::TextBox,void>
            ((shared_ptr<gui::TextBox> *)this,in_RDI);
  std::shared_ptr<gui::TextBoxStyle>::~shared_ptr((shared_ptr<gui::TextBoxStyle> *)0x1d8f75);
  sf::String::~String((String *)0x1d8f7f);
  std::locale::~locale(local_50);
  sVar1.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::TextBox>)
         sVar1.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextBox> TextBox::create(const Theme& theme, const sf::String& name) {
    return std::shared_ptr<TextBox>(new TextBox(theme.getStyle<TextBoxStyle>("TextBox"), name));
}